

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O2

Sdm_Man_t * Sdm_ManRead(void)

{
  Sdm_Man_t *pSVar1;
  
  if (s_SdmMan == (Sdm_Man_t *)0x0) {
    s_SdmMan = Sdm_ManAlloc();
  }
  pSVar1 = s_SdmMan;
  memset(s_SdmMan->nCountDsd,0,0x94c);
  return pSVar1;
}

Assistant:

Sdm_Man_t * Sdm_ManRead()
{
    if ( s_SdmMan == NULL )
        s_SdmMan = Sdm_ManAlloc();
    memset( s_SdmMan->nCountDsd, 0, sizeof(int) * DSD_CLASS_NUM );
    return s_SdmMan;
}